

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_map.cpp
# Opt level: O0

void __thiscall tst_helpers_map::convertValues(tst_helpers_map *this)

{
  initializer_list<QString> args;
  initializer_list<int> args_00;
  QString *local_138;
  QString local_108;
  QString local_f0;
  QString local_d8;
  undefined1 local_c0 [40];
  QList<QString> local_98;
  QList<QString> local_80;
  int local_54 [3];
  iterator local_48;
  undefined8 local_40;
  QList<int> local_38;
  undefined1 local_20 [8];
  PromiseType p;
  tst_helpers_map *this_local;
  
  local_54[0] = 0x2a;
  local_54[1] = 0x2b;
  local_54[2] = 0x2c;
  local_48 = local_54;
  local_40 = 3;
  args_00._M_len = 3;
  args_00._M_array = local_48;
  p.super_QPromiseBase<QList<QString>_>.m_d.d = (PromiseData<QList<QString>_> *)this;
  QList<int>::QList(&local_38,args_00);
  QtPromise::map<QList<int>,tst_helpers_map::convertValues()::__0>(local_20,&local_38);
  QList<int>::~QList(&local_38);
  local_98.d.d = (Data *)0x0;
  local_98.d.ptr = (QString *)0x0;
  local_98.d.size = 0;
  QList<QString>::QList(&local_98);
  waitForValue<QList<QString>>(&local_80,(QPromise<QList<QString>_> *)local_20,&local_98);
  QString::QString(&local_108,"43");
  QString::QString(&local_f0,"44");
  QString::QString(&local_d8,"45");
  local_c0._0_8_ = &local_108;
  local_c0._8_8_ = (char16_t *)0x3;
  args._M_len = 3;
  args._M_array = (iterator)local_c0._0_8_;
  QList<QString>::QList((QList<QString> *)(local_c0 + 0x10),args);
  QTest::qCompare<QString>
            (&local_80,(QList<QString> *)(local_c0 + 0x10),"waitForValue(p, QVector<QString>{})",
             "(QVector<QString>{\"43\", \"44\", \"45\"})",
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_map.cpp"
             ,0x4d);
  QList<QString>::~QList((QList<QString> *)(local_c0 + 0x10));
  local_138 = (QString *)local_c0;
  do {
    local_138 = local_138 + -1;
    QString::~QString(local_138);
  } while (local_138 != &local_108);
  QList<QString>::~QList(&local_80);
  QList<QString>::~QList(&local_98);
  QtPromise::QPromise<QList<QString>_>::~QPromise((QPromise<QList<QString>_> *)local_20);
  return;
}

Assistant:

void tst_helpers_map::convertValues()
{
    auto p = QtPromise::map(QVector<int>{42, 43, 44}, [](int v, ...) {
        return QString::number(v + 1);
    });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<QString>>>::value));
    QCOMPARE(waitForValue(p, QVector<QString>{}), (QVector<QString>{"43", "44", "45"}));
}